

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cont_mgau.c
# Opt level: O3

int32 mgau_eval(mgau_model_t *g,int32 m,int32 *active,float32 *x,int32 fr,int32 update_best_id)

{
  uint veclen;
  logmath_t *lmath;
  double dVar1;
  int logb_x;
  mgau_t *mgau;
  ulong uVar2;
  int iVar3;
  int32 iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  float64 fVar18;
  float64 fVar19;
  
  if (g->comp_type != 0x4e23) {
    __assert_fail("g->comp_type == MIX_INT_FLOAT_COMP",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x4a1,"int32 mgau_eval(mgau_model_t *, int32, int32 *, float32 *, int32, int32)")
    ;
  }
  veclen = g->veclen;
  uVar8 = (ulong)veclen;
  mgau = g->mgau + m;
  if (update_best_id != 0) {
    mgau->bstidx = -1;
    mgau->bstscr = -0x38000000;
    mgau->updatetime = fr;
  }
  dVar17 = (double)g->distfloor;
  lmath = g->logmath;
  fVar18 = logmath_get_base(lmath);
  dVar15 = log((double)fVar18);
  dVar15 = 1.0 / dVar15;
  if (active == (int32 *)0x0) {
    iVar3 = mgau->n_comp;
    if (iVar3 < 2) {
      uVar2 = 0;
      logb_x = -0x38000000;
    }
    else {
      logb_x = -0x38000000;
      uVar2 = 0;
      do {
        uVar9 = (uint)uVar2;
        if (mgau->fullvar == (float32 ***)0x0) {
          fVar18 = (float64)(double)(float)*(undefined8 *)(mgau->lrd + uVar2);
          fVar19 = (float64)(double)(float)((ulong)*(undefined8 *)(mgau->lrd + uVar2) >> 0x20);
          if (0 < (int)veclen) {
            uVar7 = 0;
            do {
              dVar16 = (double)((float)x[uVar7] - (float)mgau->mean[uVar2][uVar7]);
              dVar1 = (double)((float)x[uVar7] - (float)mgau->mean[uVar2 + 1][uVar7]);
              fVar18 = (float64)((double)fVar18 -
                                dVar16 * dVar16 * (double)(float)mgau->var[uVar2][uVar7]);
              fVar19 = (float64)((double)fVar19 -
                                dVar1 * dVar1 * (double)(float)mgau->var[uVar2 + 1][uVar7]);
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
        }
        else {
          fVar18 = mgau_density_full(mgau,veclen,uVar9,x);
          fVar19 = mgau_density_full(mgau,veclen,uVar9 | 1,x);
        }
        uVar11 = SUB84(dVar17,0);
        uVar13 = (undefined4)((ulong)dVar17 >> 0x20);
        uVar12 = uVar11;
        uVar14 = uVar13;
        if (dVar17 <= (double)fVar18) {
          uVar12 = SUB84(fVar18,0);
          uVar14 = (undefined4)((ulong)fVar18 >> 0x20);
        }
        iVar10 = (int)((double)CONCAT44(uVar14,uVar12) * dVar15) + mgau->mixw[uVar2];
        iVar3 = logmath_add(lmath,logb_x,iVar10);
        if (mgau->bstscr < iVar10) {
          mgau->bstidx = uVar9;
          mgau->bstscr = iVar10;
        }
        if (dVar17 <= (double)fVar19) {
          uVar11 = SUB84(fVar19,0);
          uVar13 = (undefined4)((ulong)fVar19 >> 0x20);
        }
        iVar10 = (int)((double)CONCAT44(uVar13,uVar11) * dVar15) + mgau->mixw[uVar2 + 1];
        logb_x = logmath_add(lmath,iVar3,iVar10);
        if ((update_best_id != 0) && (mgau->bstscr < iVar10)) {
          mgau->bstidx = uVar9 | 1;
          mgau->bstscr = iVar10;
        }
        uVar2 = uVar2 + 2;
        iVar3 = mgau->n_comp;
      } while ((long)uVar2 < (long)iVar3 + -1);
    }
    iVar4 = (int32)uVar2;
    if (iVar4 < iVar3) {
      if (mgau->fullvar == (float32 ***)0x0) {
        uVar7 = uVar2 & 0xffffffff;
        fVar18 = (float64)(double)(float)mgau->lrd[uVar7];
        if (0 < (int)veclen) {
          uVar6 = 0;
          do {
            dVar16 = (double)((float)x[uVar6] - (float)mgau->mean[uVar7][uVar6]);
            fVar18 = (float64)((double)fVar18 -
                              dVar16 * dVar16 * (double)(float)mgau->var[uVar7][uVar6]);
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
      }
      else {
        fVar18 = mgau_density_full(mgau,veclen,iVar4,x);
      }
      if (dVar17 <= (double)fVar18) {
        dVar17 = (double)fVar18;
      }
      iVar3 = (int)(dVar15 * dVar17) + mgau->mixw[uVar2 & 0xffffffff];
      logb_x = logmath_add(lmath,logb_x,iVar3);
      if ((update_best_id != 0) && (mgau->bstscr < iVar3)) {
        mgau->bstidx = iVar4;
        mgau->bstscr = iVar3;
      }
    }
  }
  else {
    uVar9 = *active;
    if ((int)uVar9 < 0) {
      logb_x = -0x38000000;
    }
    else {
      logb_x = -0x38000000;
      lVar5 = 0;
      do {
        if (mgau->fullvar == (float32 ***)0x0) {
          fVar18 = (float64)(double)(float)mgau->lrd[uVar9];
          if (0 < (int)veclen) {
            uVar2 = 0;
            do {
              dVar16 = (double)((float)x[uVar2] - (float)mgau->mean[uVar9][uVar2]);
              fVar18 = (float64)((double)fVar18 -
                                dVar16 * dVar16 * (double)(float)mgau->var[uVar9][uVar2]);
              uVar2 = uVar2 + 1;
            } while (uVar8 != uVar2);
          }
          if ((double)fVar18 < dVar17) {
            fVar18 = (float64)dVar17;
          }
        }
        else {
          fVar18 = mgau_density_full(mgau,veclen,uVar9,x);
        }
        iVar3 = (int)((double)fVar18 * dVar15) + mgau->mixw[uVar9];
        logb_x = logmath_add(lmath,logb_x,iVar3);
        if ((update_best_id != 0) && (mgau->bstscr < iVar3)) {
          mgau->bstidx = uVar9;
          mgau->bstscr = iVar3;
        }
        uVar9 = active[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (-1 < (int)uVar9);
    }
  }
  iVar4 = -0x38000000;
  if (-0x38000000 < logb_x) {
    iVar4 = logb_x;
  }
  return iVar4;
}

Assistant:

int32
mgau_eval(mgau_model_t * g, int32 m, int32 * active, float32 * x, int32 fr,
          int32 update_best_id)
{
    mgau_t *mgau;
    int32 veclen, score;

    veclen = mgau_veclen(g);
    mgau = &(g->mgau[m]);
    assert(g->comp_type == MIX_INT_FLOAT_COMP);

    if (update_best_id) {
        mgau->bstidx = NO_BSTIDX;
        mgau->bstscr = S3_LOGPROB_ZERO;
        mgau->updatetime = fr;
    }

    if (!active) {              /* No short list; use all */
        score =
            mgau_eval_all(mgau, x, veclen, g->distfloor, update_best_id, g->logmath);
    }
    else {
        score =
            mgau_eval_active(mgau, x, veclen, g->distfloor, active,
                             update_best_id, g->logmath);
    }

    if (score <= S3_LOGPROB_ZERO) {
        /*      E_INFO("Warning!! Score is S3_LOGPROB_ZERO\n"); */
        score = S3_LOGPROB_ZERO;
    }
    return score;
}